

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O1

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcFaceOuterBound>
                 (DB *db,LIST *params,IfcFaceOuterBound *in)

{
  size_t sVar1;
  TypeError *this;
  string local_40;
  
  sVar1 = GenericFill<Assimp::IFC::Schema_2x3::IfcFaceBound>(db,params,&in->super_IfcFaceBound);
  if (0x10 < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(params->members).
                          super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    return sVar1;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"expected 2 arguments to IfcFaceOuterBound","");
  TypeError::TypeError(this,&local_40,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcFaceOuterBound>(const DB& db, const LIST& params, IfcFaceOuterBound* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcFaceBound*>(in));
	if (params.GetSize() < 2) { throw STEP::TypeError("expected 2 arguments to IfcFaceOuterBound"); }	return base;
}